

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

ExternalArrayBuffer *
Js::ExternalArrayBuffer::Create(RefCountedBuffer *buffer,uint32 length,DynamicType *type)

{
  ScriptContext *pSVar1;
  Recycler *alloc;
  ExternalArrayBuffer *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pSVar1 = Js::Type::GetScriptContext(&type->super_Type);
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5dbadfc;
  data.filename._0_4_ = 0x4ed;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_50);
  this = (ExternalArrayBuffer *)new<Memory::Recycler>(0x48,alloc,0x3a2aea);
  ExternalArrayBuffer(this,buffer,length,type);
  return this;
}

Assistant:

ExternalArrayBuffer* ExternalArrayBuffer::Create(RefCountedBuffer* buffer, uint32 length, DynamicType * type)
    {
        // This type does not own the external memory, so don't AddExternalMemoryUsage like other ArrayBuffer types do
        return RecyclerNewFinalized(type->GetScriptContext()->GetRecycler(), ExternalArrayBuffer, buffer, length, type);
    }